

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O3

void duckdb::ModeFunction<duckdb::ModeStandard<long>>::
     Window<duckdb::ModeState<long,duckdb::ModeStandard<long>>,long,long>
               (AggregateInputData *aggr_input_data,WindowPartitionInput *partition,
               const_data_ptr_t g_state,data_ptr_t l_state,SubFrames *frames,Vector *result,
               idx_t rid)

{
  DataChunk *result_00;
  ValidityMask *pVVar1;
  data_ptr_t pdVar2;
  pointer pFVar3;
  unsigned_long *puVar4;
  ColumnDataScanState *state;
  long lVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  ModeState<long,_duckdb::ModeStandard<long>_> *pMVar6;
  ModeIncluded<duckdb::ModeState<long,_duckdb::ModeStandard<long>_>_> *pMVar7;
  _Hashtable<long,_std::pair<const_long,_duckdb::ModeAttr>,_std::allocator<std::pair<const_long,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  reference pvVar8;
  const_reference pvVar9;
  reference pvVar10;
  ulong uVar11;
  const_iterator cVar12;
  TemplatedValidityData<unsigned_long> *pTVar13;
  _Head_base<0UL,_unsigned_long_*,_false> _Var14;
  ValidityMask *pVVar15;
  idx_t seek_idx;
  FrameBounds *frame;
  pointer pFVar16;
  byte bVar17;
  Updater updater;
  ModeIncluded<duckdb::ModeState<long,_duckdb::ModeStandard<long>_>_> included;
  UpdateWindowState<duckdb::ModeState<long,_duckdb::ModeStandard<long>_>,_long> local_58;
  undefined1 local_48 [16];
  idx_t local_38;
  
  ModeState<long,_duckdb::ModeStandard<long>_>::InitializePage
            ((ModeState<long,_duckdb::ModeStandard<long>_> *)l_state,partition);
  pVVar1 = partition->filter_mask;
  pdVar2 = result->data;
  FlatVector::VerifyFlatVector(result);
  if (*(long *)l_state == *(long *)(l_state + 8)) {
    ::std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>::resize
              ((vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_> *)l_state,1);
  }
  this_00 = *(_Hashtable<long,_std::pair<const_long,_duckdb::ModeAttr>,_std::allocator<std::pair<const_long,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              **)(l_state + 0x18);
  local_48._0_8_ = pVVar1;
  local_48._8_8_ = l_state;
  if (this_00 ==
      (_Hashtable<long,_std::pair<const_long,_duckdb::ModeAttr>,_std::allocator<std::pair<const_long,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
       *)0x0) {
    Allocator::DefaultAllocator();
    this_00 = (_Hashtable<long,_std::pair<const_long,_duckdb::ModeAttr>,_std::allocator<std::pair<const_long,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)operator_new(0x38);
    *(undefined8 *)&this_00->_M_rehash_policy = 0;
    (this_00->_M_rehash_policy)._M_next_resize = 0;
    this_00->_M_buckets = &this_00->_M_single_bucket;
    this_00->_M_bucket_count = 1;
    (this_00->_M_before_begin)._M_nxt = (_Hash_node_base *)0x0;
    this_00->_M_element_count = 0;
    (this_00->_M_rehash_policy)._M_max_load_factor = 1.0;
    (this_00->_M_rehash_policy)._M_next_resize = 0;
    this_00->_M_single_bucket = (__node_base_ptr)0x0;
    *(_Hashtable<long,_std::pair<const_long,_duckdb::ModeAttr>,_std::allocator<std::pair<const_long,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      **)(l_state + 0x18) = this_00;
  }
  if (this_00->_M_element_count >> 2 < *(ulong *)(l_state + 0x28)) {
    pvVar8 = vector<duckdb::FrameBounds,_true>::back((vector<duckdb::FrameBounds,_true> *)l_state);
    uVar11 = pvVar8->end;
    pvVar9 = vector<duckdb::FrameBounds,_true>::front(frames);
    if (pvVar9->start < uVar11) {
      pvVar9 = vector<duckdb::FrameBounds,_true>::back(frames);
      uVar11 = pvVar9->end;
      pvVar8 = vector<duckdb::FrameBounds,_true>::front
                         ((vector<duckdb::FrameBounds,_true> *)l_state);
      if (pvVar8->start < uVar11) {
        local_58.included =
             (ModeIncluded<duckdb::ModeState<long,_duckdb::ModeStandard<long>_>_> *)local_48;
        local_58.state = (ModeState<long,_duckdb::ModeStandard<long>_> *)l_state;
        AggregateExecutor::
        IntersectFrames<duckdb::ModeFunction<duckdb::ModeStandard<long>>::UpdateWindowState<duckdb::ModeState<long,duckdb::ModeStandard<long>>,long>>
                  ((SubFrames *)l_state,frames,&local_58);
        goto LAB_0195452b;
      }
    }
    this_00 = *(_Hashtable<long,_std::pair<const_long,_duckdb::ModeAttr>,_std::allocator<std::pair<const_long,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                **)(l_state + 0x18);
    if (this_00 !=
        (_Hashtable<long,_std::pair<const_long,_duckdb::ModeAttr>,_std::allocator<std::pair<const_long,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
         *)0x0) goto LAB_0195442b;
  }
  else {
LAB_0195442b:
    ::std::
    _Hashtable<long,_std::pair<const_long,_duckdb::ModeAttr>,_std::allocator<std::pair<const_long,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(this_00);
  }
  l_state[0x28] = '\0';
  l_state[0x29] = '\0';
  l_state[0x2a] = '\0';
  l_state[0x2b] = '\0';
  l_state[0x2c] = '\0';
  l_state[0x2d] = '\0';
  l_state[0x2e] = '\0';
  l_state[0x2f] = '\0';
  l_state[0x38] = '\0';
  l_state[0x39] = '\0';
  l_state[0x3a] = '\0';
  l_state[0x3b] = '\0';
  l_state[0x3c] = '\0';
  l_state[0x3d] = '\0';
  l_state[0x3e] = '\0';
  l_state[0x3f] = '\0';
  l_state[0x30] = '\0';
  pFVar16 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
            super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
            super__Vector_impl_data._M_start;
  pFVar3 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
           super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pFVar16 != pFVar3) {
    result_00 = (DataChunk *)(l_state + 0x50);
    do {
      for (seek_idx = pFVar16->start; seek_idx < pFVar16->end; seek_idx = seek_idx + 1) {
        puVar4 = (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if ((puVar4 == (unsigned_long *)0x0) ||
           ((puVar4[seek_idx >> 6] >> (seek_idx & 0x3f) & 1) != 0)) {
          state = *(ColumnDataScanState **)(l_state + 0x48);
          if ((seek_idx < state->next_row_index) &&
             (uVar11 = state->current_row_index, uVar11 <= seek_idx)) {
            pVVar15 = *(ValidityMask **)(l_state + 0x98);
          }
          else {
            ColumnDataCollection::Seek
                      (*(ColumnDataCollection **)(l_state + 0x40),seek_idx,state,result_00);
            pvVar10 = vector<duckdb::Vector,_true>::operator[]
                                ((vector<duckdb::Vector,_true> *)result_00,0);
            *(data_ptr_t *)(l_state + 0x90) = pvVar10->data;
            pvVar10 = vector<duckdb::Vector,_true>::operator[]
                                ((vector<duckdb::Vector,_true> *)result_00,0);
            FlatVector::VerifyFlatVector(pvVar10);
            pVVar15 = &pvVar10->validity;
            *(ValidityMask **)(l_state + 0x98) = pVVar15;
            uVar11 = *(ulong *)(*(long *)(l_state + 0x48) + 0x50);
          }
          puVar4 = (pVVar15->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if ((puVar4 == (unsigned_long *)0x0) ||
             ((puVar4[seek_idx - uVar11 >> 6 & 0x3ffffff] >> (seek_idx - uVar11 & 0x3f) & 1) != 0))
          {
            ModeState<long,_duckdb::ModeStandard<long>_>::ModeAdd
                      ((ModeState<long,_duckdb::ModeStandard<long>_> *)l_state,seek_idx);
          }
        }
      }
      pFVar16 = pFVar16 + 1;
    } while (pFVar16 != pFVar3);
  }
LAB_0195452b:
  bVar17 = l_state[0x30];
  if (bVar17 == 0) {
    cVar12 = ModeState<long,_duckdb::ModeStandard<long>_>::Scan
                       ((ModeState<long,_duckdb::ModeStandard<long>_> *)l_state);
    if (cVar12.super__Node_iterator_base<std::pair<const_long,_duckdb::ModeAttr>,_false>._M_cur ==
        (__node_type *)0x0) {
      bVar17 = l_state[0x30];
    }
    else {
      **(undefined8 **)(l_state + 0x20) =
           *(undefined8 *)
            ((long)cVar12.super__Node_iterator_base<std::pair<const_long,_duckdb::ModeAttr>,_false>.
                   _M_cur + 8);
      lVar5 = *(long *)((long)cVar12.
                              super__Node_iterator_base<std::pair<const_long,_duckdb::ModeAttr>,_false>
                              ._M_cur + 0x10);
      *(long *)(l_state + 0x38) = lVar5;
      bVar17 = lVar5 != 0;
      l_state[0x30] = bVar17;
    }
  }
  if ((bVar17 & 1) == 0) {
    _Var14._M_head_impl =
         (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (_Var14._M_head_impl == (unsigned_long *)0x0) {
      local_38 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                ((duckdb *)&local_58,&local_38);
      pMVar7 = local_58.included;
      pMVar6 = local_58.state;
      local_58.state = (ModeState<long,_duckdb::ModeStandard<long>_> *)0x0;
      local_58.included = (ModeIncluded<duckdb::ModeState<long,_duckdb::ModeStandard<long>_>_> *)0x0
      ;
      this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)pMVar6;
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pMVar7;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58.included !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58.included);
        }
      }
      pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                          (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                            validity_data);
      _Var14._M_head_impl =
           (pTVar13->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
           _Var14._M_head_impl;
    }
    bVar17 = (byte)rid & 0x3f;
    _Var14._M_head_impl[rid >> 6] =
         _Var14._M_head_impl[rid >> 6] & (-2L << bVar17 | 0xfffffffffffffffeU >> 0x40 - bVar17);
  }
  else {
    *(undefined8 *)(pdVar2 + rid * 8) = **(undefined8 **)(l_state + 0x20);
  }
  ::std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>::operator=
            ((vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_> *)l_state,
             &frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>);
  return;
}

Assistant:

static void Window(AggregateInputData &aggr_input_data, const WindowPartitionInput &partition,
	                   const_data_ptr_t g_state, data_ptr_t l_state, const SubFrames &frames, Vector &result,
	                   idx_t rid) {
		auto &state = *reinterpret_cast<STATE *>(l_state);

		state.InitializePage(partition);
		const auto &fmask = partition.filter_mask;

		auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
		auto &rmask = FlatVector::Validity(result);
		auto &prevs = state.prevs;
		if (prevs.empty()) {
			prevs.resize(1);
		}

		ModeIncluded<STATE> included(fmask, state);

		if (!state.frequency_map) {
			state.frequency_map = TYPE_OP::CreateEmpty(Allocator::DefaultAllocator());
		}
		const size_t tau_inverse = 4; // tau==0.25
		if (state.nonzero <= (state.frequency_map->size() / tau_inverse) || prevs.back().end <= frames.front().start ||
		    frames.back().end <= prevs.front().start) {
			state.Reset();
			// for f ∈ F do
			for (const auto &frame : frames) {
				for (auto i = frame.start; i < frame.end; ++i) {
					if (included(i)) {
						state.ModeAdd(i);
					}
				}
			}
		} else {
			using Updater = UpdateWindowState<STATE, INPUT_TYPE>;
			Updater updater(state, included);
			AggregateExecutor::IntersectFrames(prevs, frames, updater);
		}

		if (!state.valid) {
			// Rescan
			auto highest_frequency = state.Scan();
			if (highest_frequency != state.frequency_map->end()) {
				*(state.mode) = highest_frequency->first;
				state.count = highest_frequency->second.count;
				state.valid = (state.count > 0);
			}
		}

		if (state.valid) {
			rdata[rid] = TYPE_OP::template Assign<INPUT_TYPE, RESULT_TYPE>(result, *state.mode);
		} else {
			rmask.Set(rid, false);
		}

		prevs = frames;
	}